

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadFunctions.cpp
# Opt level: O0

void __thiscall
Consumer::operator()
          (Consumer *this,Queue<int> *q,int id,
          vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
          *subscribeTime,
          vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
          *unsubscribeTime,TimeT readingCycleTime)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  int *piVar4;
  ulong uVar5;
  size_type sVar6;
  const_reference __rhs;
  ostream *poVar7;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar8;
  reference piVar9;
  bool bVar10;
  byte local_d9;
  int *it;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  undefined1 local_88 [8];
  unique_lock<std::mutex> mlock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_70;
  duration<long,_std::ratio<1L,_1000000000L>_> local_68;
  duration<long,_std::ratio<1L,_1000L>_> local_60;
  _Optional_payload_base<int> local_58;
  int local_50;
  bool local_49;
  int item;
  bool timeToUnsubscribe;
  time_point start;
  uint nextConsumerPeriod;
  bool lastMessage;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  *unsubscribeTime_local;
  vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
  *subscribeTime_local;
  int id_local;
  Queue<int> *q_local;
  Consumer *this_local;
  TimeT readingCycleTime_local;
  
  start.__d.__r._7_1_ = 0;
  start.__d.__r._0_4_ = 0;
  this_local = (Consumer *)readingCycleTime.__r;
  _item = (duration)std::chrono::_V2::system_clock::now();
  std::vector<int,_std::allocator<int>_>::reserve(&this->consumedValues,200);
  pvVar3 = std::
           vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
           ::at(subscribeTime,(ulong)(uint)start.__d.__r);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(pvVar3);
  do {
    rtb::Concurrency::Queue<int>::subscribe(q);
    local_49 = false;
    do {
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&this_local);
      local_58 = (_Optional_payload_base<int>)rtb::Concurrency::Queue<int>::pop(q);
      piVar4 = std::optional<int>::value((optional<int> *)&local_58);
      iVar1 = *piVar4;
      local_50 = iVar1;
      iVar2 = std::numeric_limits<int>::max();
      start.__d.__r._7_1_ = iVar1 == iVar2;
      if (!(bool)start.__d.__r._7_1_) {
        std::vector<int,_std::allocator<int>_>::push_back(&this->consumedValues,&local_50);
      }
      pvVar3 = std::
               vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               ::at(unsubscribeTime,(ulong)(uint)start.__d.__r);
      local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      local_68.__r = (rep)std::chrono::operator-
                                    (&local_70,
                                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)&item);
      local_60.__r = (rep)std::chrono::
                          duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                    (&local_68);
      local_49 = std::chrono::operator<=(pvVar3,&local_60);
      local_d9 = 0;
      if ((start.__d.__r._7_1_ & 1) == 0) {
        local_d9 = local_49 ^ 0xff;
      }
    } while ((local_d9 & 1) != 0);
    rtb::Concurrency::Queue<int>::unsubscribe(q);
    start.__d.__r._0_4_ = (uint)start.__d.__r + 1;
    uVar5 = (ulong)(uint)start.__d.__r;
    sVar6 = std::
            vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
            ::size(subscribeTime);
    if (uVar5 < sVar6) {
      pvVar3 = std::
               vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
               ::at(subscribeTime,(ulong)(uint)start.__d.__r);
      __rhs = std::
              vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              ::at(unsubscribeTime,(ulong)((uint)start.__d.__r - 1));
      mlock._8_8_ = std::chrono::operator-(pvVar3,__rhs);
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&mlock._M_owns);
    }
    bVar10 = false;
    if ((start.__d.__r._7_1_ & 1) == 0) {
      uVar5 = (ulong)(uint)start.__d.__r;
      sVar6 = std::
              vector<std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>_>
              ::size(subscribeTime);
      bVar10 = uVar5 < sVar6;
    }
  } while (bVar10);
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_88,&outputMutex);
  poVar7 = std::operator<<((ostream *)&std::cout,"Consumer ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,id);
  poVar7 = std::operator<<(poVar7," (");
  __id = std::this_thread::get_id();
  pbVar8 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar7,__id);
  std::operator<<((ostream *)pbVar8,")  popped the following values: \n");
  __end1 = std::vector<int,_std::allocator<int>_>::begin(&this->consumedValues);
  it = (int *)std::vector<int,_std::allocator<int>_>::end(&this->consumedValues);
  while( true ) {
    bVar10 = __gnu_cxx::operator!=
                       (&__end1,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )&it);
    if (!bVar10) break;
    piVar9 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar9);
    std::operator<<(poVar7," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_88);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_88);
  return;
}

Assistant:

void Consumer::operator()(Queue<int> &q,
    const int id,
    const std::vector<TimeT> &subscribeTime,
    const std::vector<TimeT> &unsubscribeTime,
    TimeT readingCycleTime) {
    bool lastMessage = false;
    unsigned nextConsumerPeriod = 0;

    auto start = std::chrono::system_clock::now();
    consumedValues.reserve(200);
    std::this_thread::sleep_for(subscribeTime.at(nextConsumerPeriod));

    // start time for consumers and producer are not exactly the same
    // but for test purposes is ok

    do {
        q.subscribe();

        bool timeToUnsubscribe = false;

        do {
            std::this_thread::sleep_for(readingCycleTime);
            auto item = q.pop().value();
            lastMessage = (item == std::numeric_limits<int>::max());
            if (!lastMessage) consumedValues.push_back(item);

            timeToUnsubscribe =
                (unsubscribeTime.at(nextConsumerPeriod)
                    <= std::chrono::duration_cast<TimeT>(std::chrono::system_clock::now() - start));

        } while (!lastMessage && !timeToUnsubscribe);
        q.unsubscribe();
        nextConsumerPeriod++;
        if (nextConsumerPeriod < subscribeTime.size()) {
            std::this_thread::sleep_for(
                subscribeTime.at(nextConsumerPeriod) - unsubscribeTime.at(nextConsumerPeriod - 1));
        }
    } while ((!lastMessage) && (nextConsumerPeriod < subscribeTime.size()));

    std::unique_lock<std::mutex> mlock(outputMutex);
    std::cout << "Consumer " << id << " (" << std::this_thread::get_id()
              << ")  popped the following values: \n";
    for (auto &it : consumedValues)
        std::cout << it << " ";
    std::cout << std::endl;
    mlock.unlock();
}